

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O2

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,mp::GenericVarNamer>::
WriteBinary<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)25,(mp::expr::Kind)38>>
          (ExprWriter<mp::internal::ExprTypes,mp::GenericVarNamer> *this,
          BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)25,_(mp::expr::Kind)38>
          e)

{
  Precedence PVar1;
  char *__s;
  BasicWriter<char> *pBVar2;
  size_t sVar3;
  Precedence precedence;
  BasicStringRef<char> value;
  
  PVar1 = expr::PrecInfo::INFO
          [*(uint *)e.super_BasicExpr<(mp::expr::Kind)25,_(mp::expr::Kind)38>.super_ExprBase.impl_];
  precedence = UNARY;
  if (PVar1 != EXPONENTIATION) {
    precedence = PVar1;
  }
  ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer>::Visit
            ((ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer> *)this,
             (NumericExpr)
             ((ExprBase *)
             ((long)e.super_BasicExpr<(mp::expr::Kind)25,_(mp::expr::Kind)38>.super_ExprBase.impl_ +
             8))->impl_,precedence);
  pBVar2 = fmt::BasicWriter<char>::operator<<(*(BasicWriter<char> **)(this + 8),' ');
  __s = internal::ExprInfo::INFO
        [*(uint *)e.super_BasicExpr<(mp::expr::Kind)25,_(mp::expr::Kind)38>.super_ExprBase.impl_].
        str;
  sVar3 = strlen(__s);
  value.size_ = sVar3;
  value.data_ = __s;
  pBVar2 = fmt::BasicWriter<char>::operator<<(pBVar2,value);
  fmt::BasicWriter<char>::operator<<(pBVar2,' ');
  ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer>::Visit
            ((ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer> *)this,
             (NumericExpr)
             ((ExprBase *)
             ((long)e.super_BasicExpr<(mp::expr::Kind)25,_(mp::expr::Kind)38>.super_ExprBase.impl_ +
             0x10))->impl_,(PVar1 != EXPONENTIATION) + PVar1);
  return;
}

Assistant:

void ExprWriter<ExprTypes, VN>::WriteBinary(ExprType e) {
  int prec = precedence(e);
  bool right_associative = prec == prec::EXPONENTIATION;
  Visit(e.lhs(), prec + (right_associative ? 1 : 0));
  writer_ << ' ' << str(e.kind()) << ' ';
  Visit(e.rhs(), prec + (right_associative ? 0 : 1));
}